

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

char * __thiscall glu::sl::ShaderParser::getTokenName(ShaderParser *this,Token token)

{
  Token token_local;
  ShaderParser *this_local;
  
  switch(token) {
  case TOKEN_INVALID:
    this_local = (ShaderParser *)anon_var_dwarf_a1c787;
    break;
  case TOKEN_EOF:
    this_local = (ShaderParser *)anon_var_dwarf_a1c79e;
    break;
  case TOKEN_STRING:
    this_local = (ShaderParser *)anon_var_dwarf_a1c7a9;
    break;
  case TOKEN_SHADER_SOURCE:
    this_local = (ShaderParser *)0xf0938d;
    break;
  case TOKEN_INT_LITERAL:
    this_local = (ShaderParser *)anon_var_dwarf_a1c7bf;
    break;
  case TOKEN_FLOAT_LITERAL:
    this_local = (ShaderParser *)anon_var_dwarf_a1c7ca;
    break;
  case TOKEN_IDENTIFIER:
    this_local = (ShaderParser *)anon_var_dwarf_a1c7d5;
    break;
  case TOKEN_TRUE:
    this_local = (ShaderParser *)0xf166b5;
    break;
  case TOKEN_FALSE:
    this_local = (ShaderParser *)0xfb27e3;
    break;
  case TOKEN_DESC:
    this_local = (ShaderParser *)anon_var_dwarf_a094fc;
    break;
  case TOKEN_EXPECT:
    this_local = (ShaderParser *)anon_var_dwarf_a09507;
    break;
  case TOKEN_GROUP:
    this_local = (ShaderParser *)0xf09a6d;
    break;
  case TOKEN_CASE:
    this_local = (ShaderParser *)0xf6cd4a;
    break;
  case TOKEN_END:
    this_local = (ShaderParser *)0xf91f89;
    break;
  case TOKEN_VALUES:
    this_local = (ShaderParser *)0xf4aa68;
    break;
  case TOKEN_BOTH:
    this_local = (ShaderParser *)0xf2b215;
    break;
  case TOKEN_VERTEX:
    this_local = (ShaderParser *)0xf6d55a;
    break;
  case TOKEN_FRAGMENT:
    this_local = (ShaderParser *)0xf4b66c;
    break;
  case TOKEN_UNIFORM:
    this_local = (ShaderParser *)0xf23a9a;
    break;
  case TOKEN_INPUT:
    this_local = (ShaderParser *)0xf4b62f;
    break;
  case TOKEN_OUTPUT:
    this_local = (ShaderParser *)0xf6d5c2;
    break;
  case TOKEN_FLOAT:
    this_local = (ShaderParser *)0xf6b0d0;
    break;
  case TOKEN_FLOAT_VEC2:
    this_local = (ShaderParser *)0xf995ab;
    break;
  case TOKEN_FLOAT_VEC3:
    this_local = (ShaderParser *)0xf995b1;
    break;
  case TOKEN_FLOAT_VEC4:
    this_local = (ShaderParser *)0xf62cd9;
    break;
  case TOKEN_FLOAT_MAT2:
    this_local = (ShaderParser *)0xf99564;
    break;
  case TOKEN_FLOAT_MAT2X3:
    this_local = (ShaderParser *)0xf9956a;
    break;
  case TOKEN_FLOAT_MAT2X4:
    this_local = (ShaderParser *)0xf99572;
    break;
  case TOKEN_FLOAT_MAT3X2:
    this_local = (ShaderParser *)0xf9957a;
    break;
  case TOKEN_FLOAT_MAT3:
    this_local = (ShaderParser *)0xf99582;
    break;
  case TOKEN_FLOAT_MAT3X4:
    this_local = (ShaderParser *)0xf99588;
    break;
  case TOKEN_FLOAT_MAT4X2:
    this_local = (ShaderParser *)0xf99590;
    break;
  case TOKEN_FLOAT_MAT4X3:
    this_local = (ShaderParser *)0xf99598;
    break;
  case TOKEN_FLOAT_MAT4:
    this_local = (ShaderParser *)0xf995a0;
    break;
  case TOKEN_INT:
    this_local = (ShaderParser *)0xf2145d;
    break;
  case TOKEN_INT_VEC2:
    this_local = (ShaderParser *)0xf6ac9b;
    break;
  case TOKEN_INT_VEC3:
    this_local = (ShaderParser *)anon_var_dwarf_28651b;
    break;
  case TOKEN_INT_VEC4:
    this_local = (ShaderParser *)0xf258fc;
    break;
  case TOKEN_UINT:
    this_local = (ShaderParser *)0xf4a500;
    break;
  case TOKEN_UINT_VEC2:
    this_local = (ShaderParser *)anon_var_dwarf_8a27e6;
    break;
  case TOKEN_UINT_VEC3:
    this_local = (ShaderParser *)anon_var_dwarf_8a27f1;
    break;
  case TOKEN_UINT_VEC4:
    this_local = (ShaderParser *)0xf2592b;
    break;
  case TOKEN_BOOL:
    this_local = (ShaderParser *)anon_var_dwarf_99ac84;
    break;
  case TOKEN_BOOL_VEC2:
    this_local = (ShaderParser *)anon_var_dwarf_99ac8e;
    break;
  case TOKEN_BOOL_VEC3:
    this_local = (ShaderParser *)anon_var_dwarf_99ac98;
    break;
  case TOKEN_BOOL_VEC4:
    this_local = (ShaderParser *)anon_var_dwarf_99aca2;
    break;
  default:
    this_local = (ShaderParser *)anon_var_dwarf_a1c7ec;
    break;
  case TOKEN_TESSELLATION_CONTROL:
    this_local = (ShaderParser *)anon_var_dwarf_450be8;
    break;
  case TOKEN_TESSELLATION_EVALUATION:
    this_local = (ShaderParser *)anon_var_dwarf_450bf3;
    break;
  case TOKEN_GEOMETRY:
    this_local = (ShaderParser *)0xf6d197;
    break;
  case TOKEN_REQUIRE:
    this_local = (ShaderParser *)0xf18bb1;
    break;
  case TOKEN_IN:
    this_local = (ShaderParser *)0xf190da;
    break;
  case TOKEN_IMPORT:
    this_local = (ShaderParser *)anon_var_dwarf_a0971d;
    break;
  case TOKEN_PIPELINE_PROGRAM:
    this_local = (ShaderParser *)anon_var_dwarf_a09728;
    break;
  case TOKEN_ACTIVE_STAGES:
    this_local = (ShaderParser *)anon_var_dwarf_a0973f;
    break;
  case TOKEN_ASSIGN:
    this_local = (ShaderParser *)0xf1e53c;
    break;
  case TOKEN_PLUS:
    this_local = (ShaderParser *)0xf20109;
    break;
  case TOKEN_MINUS:
    this_local = (ShaderParser *)0xfb24f6;
    break;
  case TOKEN_COMMA:
    this_local = (ShaderParser *)0xf95497;
    break;
  case TOKEN_VERTICAL_BAR:
    this_local = (ShaderParser *)anon_var_dwarf_4fc86;
    break;
  case TOKEN_SEMI_COLON:
    this_local = (ShaderParser *)0xf67e20;
    break;
  case TOKEN_LEFT_PAREN:
    this_local = (ShaderParser *)0xf0992e;
    break;
  case TOKEN_RIGHT_PAREN:
    this_local = (ShaderParser *)0xf2e642;
    break;
  case TOKEN_LEFT_BRACKET:
    this_local = (ShaderParser *)0xf706e5;
    break;
  case TOKEN_RIGHT_BRACKET:
    this_local = (ShaderParser *)0xf2b90f;
    break;
  case TOKEN_LEFT_BRACE:
    this_local = (ShaderParser *)0xf33907;
    break;
  case TOKEN_RIGHT_BRACE:
    this_local = (ShaderParser *)0xf26f8f;
    break;
  case TOKEN_GREATER:
    this_local = (ShaderParser *)0xf52abf;
  }
  return (char *)this_local;
}

Assistant:

const char* ShaderParser::getTokenName (Token token)
{
	switch (token)
	{
		case TOKEN_INVALID:					return "<invalid>";
		case TOKEN_EOF:						return "<eof>";
		case TOKEN_STRING:					return "<string>";
		case TOKEN_SHADER_SOURCE:			return "source";

		case TOKEN_INT_LITERAL:				return "<int>";
		case TOKEN_FLOAT_LITERAL:			return "<float>";

		// identifiers
		case TOKEN_IDENTIFIER:				return "<identifier>";
		case TOKEN_TRUE:					return "true";
		case TOKEN_FALSE:					return "false";
		case TOKEN_DESC:					return "desc";
		case TOKEN_EXPECT:					return "expect";
		case TOKEN_GROUP:					return "group";
		case TOKEN_CASE:					return "case";
		case TOKEN_END:						return "end";
		case TOKEN_VALUES:					return "values";
		case TOKEN_BOTH:					return "both";
		case TOKEN_VERTEX:					return "vertex";
		case TOKEN_FRAGMENT:				return "fragment";
		case TOKEN_TESSELLATION_CONTROL:	return "tessellation_control";
		case TOKEN_TESSELLATION_EVALUATION:	return "tessellation_evaluation";
		case TOKEN_GEOMETRY:				return "geometry";
		case TOKEN_REQUIRE:					return "require";
		case TOKEN_UNIFORM:					return "uniform";
		case TOKEN_INPUT:					return "input";
		case TOKEN_OUTPUT:					return "output";
		case TOKEN_FLOAT:					return "float";
		case TOKEN_FLOAT_VEC2:				return "vec2";
		case TOKEN_FLOAT_VEC3:				return "vec3";
		case TOKEN_FLOAT_VEC4:				return "vec4";
		case TOKEN_FLOAT_MAT2:				return "mat2";
		case TOKEN_FLOAT_MAT2X3:			return "mat2x3";
		case TOKEN_FLOAT_MAT2X4:			return "mat2x4";
		case TOKEN_FLOAT_MAT3X2:			return "mat3x2";
		case TOKEN_FLOAT_MAT3:				return "mat3";
		case TOKEN_FLOAT_MAT3X4:			return "mat3x4";
		case TOKEN_FLOAT_MAT4X2:			return "mat4x2";
		case TOKEN_FLOAT_MAT4X3:			return "mat4x3";
		case TOKEN_FLOAT_MAT4:				return "mat4";
		case TOKEN_INT:						return "int";
		case TOKEN_INT_VEC2:				return "ivec2";
		case TOKEN_INT_VEC3:				return "ivec3";
		case TOKEN_INT_VEC4:				return "ivec4";
		case TOKEN_UINT:					return "uint";
		case TOKEN_UINT_VEC2:				return "uvec2";
		case TOKEN_UINT_VEC3:				return "uvec3";
		case TOKEN_UINT_VEC4:				return "uvec4";
		case TOKEN_BOOL:					return "bool";
		case TOKEN_BOOL_VEC2:				return "bvec2";
		case TOKEN_BOOL_VEC3:				return "bvec3";
		case TOKEN_BOOL_VEC4:				return "bvec4";
		case TOKEN_IN:						return "in";
		case TOKEN_IMPORT:					return "import";
		case TOKEN_PIPELINE_PROGRAM:		return "pipeline_program";
		case TOKEN_ACTIVE_STAGES:			return "active_stages";

		case TOKEN_ASSIGN:					return "=";
		case TOKEN_PLUS:					return "+";
		case TOKEN_MINUS:					return "-";
		case TOKEN_COMMA:					return ",";
		case TOKEN_VERTICAL_BAR:			return "|";
		case TOKEN_SEMI_COLON:				return ";";
		case TOKEN_LEFT_PAREN:				return "(";
		case TOKEN_RIGHT_PAREN:				return ")";
		case TOKEN_LEFT_BRACKET:			return "[";
		case TOKEN_RIGHT_BRACKET:			return "]";
		case TOKEN_LEFT_BRACE:				return "{";
		case TOKEN_RIGHT_BRACE:				return "}";
		case TOKEN_GREATER:					return ">";

		default:							return "<unknown>";
	}
}